

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t ilen,uchar *input,uchar *output)

{
  int iVar1;
  bool bVar2;
  int local_6c;
  int local_64;
  uchar *puStack_60;
  int rng_dl;
  uchar *p;
  int ret;
  size_t olen;
  size_t nb_pad;
  uchar *input_local;
  size_t ilen_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if ((mode == 1) && (ctx->padding != 0)) {
    ctx_local._4_4_ = -0x4080;
  }
  else if ((ilen + 0xb < ilen) || (ctx->len < ilen + 0xb)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    olen = (ctx->len - 3) - ilen;
    *output = '\0';
    if (mode == 0) {
      if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
        return -0x4080;
      }
      puStack_60 = output + 2;
      output[1] = '\x02';
      while (olen != 0) {
        local_64 = 100;
        do {
          iVar1 = (*f_rng)(p_rng,puStack_60,1);
          bVar2 = false;
          if (*puStack_60 == '\0') {
            local_64 = local_64 + -1;
            bVar2 = false;
            if (local_64 != 0) {
              bVar2 = iVar1 == 0;
            }
          }
        } while (bVar2);
        if ((local_64 == 0) || (iVar1 != 0)) {
          return iVar1 + -0x4480;
        }
        puStack_60 = puStack_60 + 1;
        olen = olen - 1;
      }
    }
    else {
      output[1] = '\x01';
      puStack_60 = output + 2;
      while (olen != 0) {
        *puStack_60 = 0xff;
        puStack_60 = puStack_60 + 1;
        olen = olen - 1;
      }
    }
    *puStack_60 = '\0';
    if (ilen != 0) {
      memcpy(puStack_60 + 1,input,ilen);
    }
    if (mode == 0) {
      local_6c = mbedtls_rsa_public(ctx,output,output);
    }
    else {
      local_6c = mbedtls_rsa_private(ctx,f_rng,p_rng,output,output);
    }
    ctx_local._4_4_ = local_6c;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode, size_t ilen,
                                 const unsigned char *input,
                                 unsigned char *output )
{
    size_t nb_pad, olen;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = output;

    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( output != NULL );
    RSA_VALIDATE_RET( ilen == 0 || input != NULL );

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;

    /* first comparison checks for overflow */
    if( ilen + 11 < ilen || olen < ilen + 11 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    nb_pad = olen - 3 - ilen;

    *p++ = 0;
    if( mode == MBEDTLS_RSA_PUBLIC )
    {
        if( f_rng == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        *p++ = MBEDTLS_RSA_CRYPT;

        while( nb_pad-- > 0 )
        {
            int rng_dl = 100;

            do {
                ret = f_rng( p_rng, p, 1 );
            } while( *p == 0 && --rng_dl && ret == 0 );

            /* Check if RNG failed to generate data */
            if( rng_dl == 0 || ret != 0 )
                return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

            p++;
        }
    }
    else
    {
        *p++ = MBEDTLS_RSA_SIGN;

        while( nb_pad-- > 0 )
            *p++ = 0xFF;
    }

    *p++ = 0;
    if( ilen != 0 )
        memcpy( p, input, ilen );

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, output, output )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, output, output ) );
}